

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkloader.c
# Opt level: O3

ktxVulkanDeviceInfo *
ktxVulkanDeviceInfo_CreateEx
          (VkInstance instance,VkPhysicalDevice physicalDevice,VkDevice device,VkQueue queue,
          VkCommandPool cmdPool,VkAllocationCallbacks *pAllocator,ktxVulkanFunctions *pFuncs)

{
  ktx_error_code_e kVar1;
  ktxVulkanDeviceInfo *This;
  
  This = (ktxVulkanDeviceInfo *)malloc(0x330);
  if (This != (ktxVulkanDeviceInfo *)0x0) {
    kVar1 = ktxVulkanDeviceInfo_ConstructEx
                      (This,instance,physicalDevice,device,queue,cmdPool,pAllocator,pFuncs);
    if (kVar1 == KTX_SUCCESS) {
      return This;
    }
    free(This);
  }
  return (ktxVulkanDeviceInfo *)0x0;
}

Assistant:

ktxVulkanDeviceInfo*
ktxVulkanDeviceInfo_CreateEx(VkInstance instance,
                             VkPhysicalDevice physicalDevice, VkDevice device,
                             VkQueue queue, VkCommandPool cmdPool,
                             const VkAllocationCallbacks* pAllocator,
                             const ktxVulkanFunctions* pFuncs)
{
    ktxVulkanDeviceInfo* newvdi;
    newvdi = (ktxVulkanDeviceInfo*)malloc(sizeof(ktxVulkanDeviceInfo));
    if (newvdi != NULL) {
        if (ktxVulkanDeviceInfo_ConstructEx(newvdi, instance, physicalDevice,
                                            device, queue, cmdPool, pAllocator,
                                            pFuncs) != KTX_SUCCESS)
        {
            free(newvdi);
            newvdi = 0;
        }
    }
    return newvdi;
}